

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlFeatureDefn::DebugXmlFeatures(GdlFeatureDefn *this,ofstream *strmOut,string *staPathToCur)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  string *staPath;
  ostream *poVar4;
  ulong uVar5;
  size_type_conflict sVar6;
  GrpLineAndFile *in_RDX;
  ostream *in_RSI;
  GdlFeatureDefn *in_RDI;
  uint ifset;
  string staT;
  char rgch [5];
  uint nID;
  GrpLineAndFile lnf;
  GdlFeatureDefn *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  GrpLineAndFile *in_stack_fffffffffffffe80;
  string local_110 [36];
  uint local_ec;
  string local_e8 [32];
  string local_c8 [8];
  string *in_stack_ffffffffffffff40;
  ofstream *in_stack_ffffffffffffff48;
  GdlFeatureSetting *in_stack_ffffffffffffff50;
  allocator local_a1;
  string local_a0 [35];
  char local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  string local_78 [52];
  undefined4 local_44;
  GrpLineAndFile local_40;
  ostream *local_10;
  
  local_10 = in_RSI;
  GdlObject::LineAndFile(&(in_RDI->super_GdlDefn).super_GdlObject);
  GrpLineAndFile::GrpLineAndFile
            (in_stack_fffffffffffffe80,
             (GrpLineAndFile *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_44 = ID(in_RDI);
  staPath = (string *)std::operator<<(local_10,"    <feature name=\"");
  Name_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar4 = std::operator<<((ostream *)staPath,local_78);
  poVar4 = std::operator<<(poVar4,"\" featureID=\"");
  std::ostream::operator<<(poVar4,local_44);
  std::__cxx11::string::~string(local_78);
  if (0xffffff < local_44) {
    local_79 = 0;
    local_7a = (undefined1)local_44;
    local_7b = local_44._1_1_;
    local_7c = local_44._2_1_;
    local_7d = local_44._3_1_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,&local_7d,&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    poVar4 = std::operator<<(local_10,"\" featureIDstring=\"");
    std::operator<<(poVar4,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  poVar4 = std::operator<<(local_10,"\" index=\"");
  iVar2 = InternalID(in_RDI);
  std::ostream::operator<<(poVar4,iVar2);
  bVar1 = GrpLineAndFile::NotSet(&local_40);
  if (!bVar1) {
    uVar3 = ID(in_RDI);
    if (uVar3 != 1) {
      poVar4 = std::operator<<(local_10,"\" inFile=\"");
      std::__cxx11::string::string(local_e8,(string *)in_RDX);
      GrpLineAndFile::FileWithPath(in_RDX,staPath);
      poVar4 = std::operator<<(poVar4,local_c8);
      poVar4 = std::operator<<(poVar4,"\" atLine=\"");
      iVar2 = GrpLineAndFile::OriginalLine(&local_40);
      std::ostream::operator<<(poVar4,iVar2);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_e8);
    }
  }
  std::operator<<(local_10,"\" >\n");
  local_ec = 0;
  while( true ) {
    uVar5 = (ulong)local_ec;
    sVar6 = std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::size
                      (&in_RDI->m_vpfset);
    if (sVar6 <= uVar5) break;
    std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::operator[]
              (&in_RDI->m_vpfset,(ulong)local_ec);
    std::__cxx11::string::string(local_110,(string *)in_RDX);
    GdlFeatureSetting::DebugXmlFeatures
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_110);
    local_ec = local_ec + 1;
  }
  std::operator<<(local_10,"    </feature>\n");
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x123f8f);
  return;
}

Assistant:

void GdlFeatureDefn::DebugXmlFeatures(std::ofstream & strmOut, std::string staPathToCur)
{
	GrpLineAndFile lnf = this->LineAndFile();
	unsigned int nID = this->ID();
	strmOut << "    <feature name=\"" << this->Name()
		<< "\" featureID=\"" << nID;
	if (nID > 0xFFFFFF)
	{
		// Output string format as well.

		char rgch[5];
		rgch[4] = 0;
		rgch[3] = (char)(nID & 0x000000FF);
		rgch[2] = (char)((nID & 0x0000FF00) >> 8);
		rgch[1] = (char)((nID & 0x00FF0000) >> 16);
		rgch[0] = (char)((nID & 0xFF000000) >> 24);
		std::string staT(rgch);

		// Why doesn't this work??
		//union {
		//	char rgch[4];
		//	unsigned int n;
		//} featid;
		//featid.n = nID;
		//// Reverse them.
		//char chTmp = featid.rgch[0];
		//featid.rgch[0] = featid.rgch[4];
		//featid.rgch[4] = chTmp;
		//chTmp = featid.rgch[2];
		//featid.rgch[2] = featid.rgch[3];
		//featid.rgch[3] = chTmp;
		//std::string staT(featid.rgch);
		
		strmOut << "\" featureIDstring=\"" << staT;
	}
	strmOut << "\" index=\"" << this->InternalID();

	if (!lnf.NotSet() && this->ID() != kfidStdLang)
		strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
			<< "\" atLine=\"" << lnf.OriginalLine();

	strmOut << "\" >\n";

	for (unsigned int ifset = 0; ifset < m_vpfset.size(); ifset++)
	{
		m_vpfset[ifset]->DebugXmlFeatures(strmOut, staPathToCur);
	}

	strmOut << "    </feature>\n";
}